

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

UCVarValue FBaseCVar::FromGUID(GUID *guid,ECVarType type)

{
  GUID *in_RAX;
  GUID *local_8;
  
  local_8 = in_RAX;
  switch(type) {
  case CVAR_Bool:
    local_8 = (GUID *)((ulong)in_RAX & 0xffffffffffffff00);
    break;
  case CVAR_Int:
  case CVAR_Float:
    local_8 = (GUID *)((ulong)in_RAX & 0xffffffff00000000);
    break;
  case CVAR_String:
    local_8 = (GUID *)ToString((UCVarValue)guid,CVAR_GUID);
    break;
  case CVAR_GUID:
    local_8 = guid;
  }
  return (UCVarValue)local_8.String;
}

Assistant:

UCVarValue FBaseCVar::FromGUID (const GUID &guid, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = false;
		break;

	case CVAR_Int:
		ret.Int = 0;
		break;

	case CVAR_Float:
		ret.Float = 0.f;
		break;

	case CVAR_String:
		ret.pGUID = &guid;
		ret.String = ToString (ret, CVAR_GUID);
		break;

	case CVAR_GUID:
		ret.pGUID = &guid;
		break;

	default:
		break;
	}

	return ret;
}